

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

time_t __thiscall pstore::file::file_handle::latest_time(file_handle *this)

{
  initializer_list<long> __l;
  int iVar1;
  char *__file;
  int *piVar2;
  long lVar3;
  __blkcnt_t local_100;
  __syscall_slong_t local_f8;
  __syscall_slong_t local_f0;
  iterator local_e8;
  undefined8 local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int err;
  stat buf;
  file_handle *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)this;
  memset(local_a0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_a4 = iVar1;
    std::__cxx11::string::string((string *)&local_c8,(string *)&this->path_);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"stat failed",&local_c8);
  }
  local_100 = buf.st_blocks;
  local_f8 = buf.st_atim.tv_nsec;
  local_f0 = buf.st_mtim.tv_nsec;
  local_e8 = &local_100;
  local_e0 = 3;
  __l._M_len = 3;
  __l._M_array = local_e8;
  lVar3 = std::max<long>(__l);
  return lVar3;
}

Assistant:

std::time_t file_handle::latest_time () const {
            struct stat buf {};
            if (::stat (path_.c_str (), &buf) != 0) {
                int const err = errno;
                raise_file_error (err, "stat failed", path_);
            }
/// The time members of struct stat might be called st_Xtimespec (of type struct timespec) or
/// st_Xtime (and be of type time_t). This macro is defined in the former situation.
#    ifdef PSTORE_STAT_TIMESPEC
            auto compare = [] (struct timespec const & lhs, struct timespec const & rhs) {
                return std::make_pair (lhs.tv_sec, lhs.tv_nsec) <
                       std::make_pair (rhs.tv_sec, rhs.tv_nsec);
            };
            auto const t =
                std::max ({buf.st_atimespec, buf.st_mtimespec, buf.st_ctimespec}, compare);
            constexpr auto nano = 1000000000;
            return t.tv_sec + (t.tv_nsec + (nano / 2)) / nano;
#    else
            return std::max ({buf.st_atime, buf.st_mtime, buf.st_ctime});
#    endif
        }